

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case0164(DeclarationBinderTester *this)

{
  Expectation *pEVar1;
  Decl *pDVar2;
  Ty *this_00;
  socklen_t __len;
  allocator<char> local_56d;
  allocator<char> local_56c;
  allocator<char> local_56b;
  allocator<char> local_56a;
  allocator<char> local_569;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8 [32];
  Expectation local_4a8;
  Expectation local_3f0;
  Decl local_338;
  Decl local_270;
  Decl local_1a8;
  Decl local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>(local_4c8,"x ( y z ) { }",&local_569);
  Expectation::Expectation(&local_4a8);
  std::__cxx11::string::string
            ((string *)&local_4e8,
             (string *)
             &DeclarationBinder::DiagnosticsReporter::
              ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_4a8,Error,&local_4e8);
  Decl::Decl(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"x",&local_56a);
  pDVar2 = Decl::Function(&local_1a8,&local_508,File);
  pDVar2 = Ty::Basic(&pDVar2->ty_,Int_S,None);
  pDVar2 = Ty::Derived(&pDVar2->ty_,Function,None,None);
  this_00 = Ty::addParam(&pDVar2->ty_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"y",&local_56b);
  pDVar2 = Ty::Typedef(this_00,&local_528,None);
  Decl::Decl(&local_e0,pDVar2);
  pEVar1 = Expectation::declaration(pEVar1,&local_e0);
  Decl::Decl(&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"z",&local_56c);
  __len = 3;
  pDVar2 = Decl::Object(&local_338,&local_548,ParameterDeclaration,Block);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"y",&local_56d);
  pDVar2 = Ty::Typedef(&pDVar2->ty_,&local_568,None);
  Decl::Decl(&local_270,pDVar2);
  pEVar1 = Expectation::declaration(pEVar1,&local_270);
  Expectation::Expectation(&local_3f0,pEVar1);
  bind(this,(int)local_4c8,(sockaddr *)&local_3f0,__len);
  Expectation::~Expectation(&local_3f0);
  Decl::~Decl(&local_270);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  Decl::~Decl(&local_338);
  Decl::~Decl(&local_e0);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  Decl::~Decl(&local_1a8);
  std::__cxx11::string::~string((string *)&local_4e8);
  Expectation::~Expectation(&local_4a8);
  std::__cxx11::string::~string(local_4c8);
  return;
}

Assistant:

void DeclarationBinderTester::case0164()
{
    bind("x ( y z ) { }",
         Expectation()
             .diagnostic(Expectation::ErrorOrWarn::Error,
                         DeclarationBinder::DiagnosticsReporter::ID_of_TypeSpecifierMissingDefaultsToInt)
             .declaration(Decl()
                      .Function("x", ScopeKind::File)
                      .ty_.Basic(BasicTypeKind::Int_S)
                      .ty_.Derived(TypeKind::Function)
                      .ty_.addParam().Typedef("y"))
             .declaration(Decl()
                      .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::Block)
                      .ty_.Typedef("y")));
}